

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpConnection.cpp
# Opt level: O3

void __thiscall sznet::net::KcpConnection::connectDestroyed(KcpConnection *this)

{
  EventLoop *this_00;
  bool bVar1;
  __shared_ptr<sznet::net::KcpConnection,(__gnu_cxx::_Lock_policy)2> local_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  this_00 = this->m_loop;
  bVar1 = EventLoop::isInLoopThread(this_00);
  if (!bVar1) {
    EventLoop::abortNotInLoopThread(this_00);
  }
  if (this->m_state == kConnected) {
    this->m_state = kDisconnected;
    std::__shared_ptr<sznet::net::KcpConnection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<sznet::net::KcpConnection,void>
              (local_28,(__weak_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this);
    if ((this->m_kcpConnectionCallback).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->m_kcpConnectionCallback)._M_invoker)
              ((_Any_data *)&this->m_kcpConnectionCallback,
               (shared_ptr<sznet::net::KcpConnection> *)local_28);
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    }
  }
  return;
}

Assistant:

void KcpConnection::connectDestroyed()
{
	m_loop->assertInLoopThread();
	if (m_state == kConnected)
	{
		setState(kDisconnected);
		m_kcpConnectionCallback(shared_from_this());
	}
}